

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

nng_err nng_pipe_notify(nng_socket s,nng_pipe_ev ev,nng_pipe_cb cb,void *arg)

{
  nni_sock *local_38;
  nni_sock *sock;
  void *pvStack_28;
  nng_err rv;
  void *arg_local;
  nng_pipe_cb cb_local;
  uint32_t local_10;
  nng_pipe_ev ev_local;
  nng_socket s_local;
  
  pvStack_28 = arg;
  arg_local = cb;
  cb_local._4_4_ = ev;
  local_10 = s.id;
  sock._4_4_ = nni_sock_find(&local_38,s.id);
  ev_local = sock._4_4_;
  if (sock._4_4_ == NNG_PIPE_EV_NONE) {
    nni_sock_set_pipe_cb(local_38,cb_local._4_4_,(nng_pipe_cb)arg_local,pvStack_28);
    nni_sock_rele(local_38);
    ev_local = NNG_PIPE_EV_NONE;
  }
  return ev_local;
}

Assistant:

nng_err
nng_pipe_notify(nng_socket s, nng_pipe_ev ev, nng_pipe_cb cb, void *arg)
{
	nng_err   rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}

	nni_sock_set_pipe_cb(sock, ev, cb, arg);
	nni_sock_rele(sock);
	return (NNG_OK);
}